

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall Matrix::operator*(Matrix *this,Matrix *other)

{
  runtime_error *this_00;
  double *pdVar1;
  Matrix *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  double dVar3;
  double dVar4;
  Matrix MVar5;
  int local_4c;
  double dStack_48;
  int k;
  double ij;
  int local_38;
  int j;
  int i;
  Matrix *other_local;
  Matrix *this_local;
  Matrix *product;
  
  Matrix(this,other->rows,in_RDX->cols);
  if (other->cols == in_RDX->rows) {
    uVar2 = extraout_RDX;
    for (local_38 = 0; local_38 < other->rows; local_38 = local_38 + 1) {
      for (ij._4_4_ = 0; ij._4_4_ < in_RDX->cols; ij._4_4_ = ij._4_4_ + 1) {
        dStack_48 = 0.0;
        for (local_4c = 0; local_4c < other->cols; local_4c = local_4c + 1) {
          dVar3 = operator()(other,local_38,local_4c);
          dVar4 = operator()(in_RDX,local_4c,ij._4_4_);
          dStack_48 = dVar3 * dVar4 + dStack_48;
        }
        pdVar1 = operator()(this,local_38,ij._4_4_);
        *pdVar1 = dStack_48;
        uVar2 = extraout_RDX_00;
      }
    }
    MVar5.rows = (int)uVar2;
    MVar5.cols = (int)((ulong)uVar2 >> 0x20);
    MVar5.data = (double *)this;
    return MVar5;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator*(const Matrix& other) const
{
    Matrix product = Matrix(rows, other.cols);

    if (cols != other.rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < other.cols; ++j)
        {
            double ij = 0;
            for (int k = 0; k < cols; ++k)
            {
                ij += this->operator()(i, k) * other(k, j);
            }
            product(i, j) = ij;
        }
    }

    return product;
}